

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O1

bool __thiscall wasm::EffectAnalyzer::invalidates(EffectAnalyzer *this,EffectAnalyzer *other)

{
  bool bVar1;
  size_type sVar2;
  _Base_ptr p_Var3;
  const_iterator cVar4;
  byte bVar5;
  key_type local_58;
  _Rb_tree_node_base *local_40;
  _Base_ptr local_38;
  
  if ((((((((this->branchesOut == false) && (this->throws_ == false)) &&
          ((this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
         ((this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) ||
        ((other->trap == false && (bVar1 = hasNonTrapSideEffects(other), !bVar1)))) &&
       ((((other->branchesOut == false &&
          ((other->throws_ == false &&
           ((other->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) &&
         ((other->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) ||
        ((this->trap == false && (bVar1 = hasNonTrapSideEffects(this), !bVar1)))))) &&
      ((((((bVar1 = this->writesMemory, bVar1 == false && (this->calls != true)) ||
          (((other->calls == false && (other->readsMemory == false)) &&
           (other->writesMemory == false)))) &&
         (((other->writesMemory == false && (other->calls != true)) ||
          ((this->calls == false && (((this->readsMemory | bVar1) & 1U) == 0)))))) &&
        (((this->writesTable == false && (this->calls != true)) ||
         ((other->calls == false && ((other->readsTable == false && (other->writesTable == false))))
         )))) && ((((other->writesTable == false && (other->calls != true)) ||
                   ((this->calls == false && (((this->writesTable | this->readsTable) & 1U) == 0))))
                  && (((this->writesStruct == false && (this->calls != true)) ||
                      (((other->calls == false && (other->readsMutableStruct == false)) &&
                       (other->writesStruct == false)))))))))) &&
     (((((other->writesStruct == false && (other->calls != true)) ||
        ((this->calls == false && (((this->writesStruct | this->readsMutableStruct) & 1U) == 0))))
       && (((this->writesArray == false && (this->calls != true)) ||
           ((other->calls == false &&
            ((other->readsArray == false && (other->writesArray == false)))))))) &&
      ((((other->writesArray == false && (other->calls != true)) ||
        ((this->calls == false && (((this->writesArray | this->readsArray) & 1U) == 0)))) &&
       (((this->danglingPop == false && (other->danglingPop == false)) &&
        (((this->isAtomic != true ||
          ((other->calls == false && (((other->writesMemory | other->readsMemory) & 1U) == 0)))) &&
         ((other->isAtomic != true ||
          ((this->calls == false && (((bVar1 | this->readsMemory) & 1U) == 0)))))))))))))) {
    p_Var3 = (this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_40 = &(this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_38 = (_Base_ptr)CONCAT71(local_38._1_7_,p_Var3 == local_40);
    if (p_Var3 != local_40) {
      local_58.super_IString.str._M_len =
           CONCAT44(local_58.super_IString.str._M_len._4_4_,p_Var3[1]._M_color);
      sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        (&other->localsRead,(key_type *)&local_58);
      if (sVar2 == 0) {
        do {
          sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  count(&other->localsWritten,(key_type *)&local_58);
          if (sVar2 != 0) break;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
          local_38 = (_Base_ptr)CONCAT71(local_38._1_7_,p_Var3 == local_40);
          if (p_Var3 == local_40) goto LAB_0015ce99;
          local_58.super_IString.str._M_len =
               CONCAT44(local_58.super_IString.str._M_len._4_4_,p_Var3[1]._M_color);
          sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  count(&other->localsRead,(key_type *)&local_58);
        } while (sVar2 == 0);
      }
      if (((ulong)local_38 & 1) == 0) {
        return true;
      }
    }
LAB_0015ce99:
    p_Var3 = (this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_38 = &(this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_header;
    bVar1 = p_Var3 == local_38;
    if (!bVar1) {
      local_40 = (_Rb_tree_node_base *)&other->localsWritten;
      local_58.super_IString.str._M_len =
           CONCAT44(local_58.super_IString.str._M_len._4_4_,p_Var3[1]._M_color);
      while (sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_40,(key_type *)&local_58), sVar2 == 0) {
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
        bVar1 = p_Var3 == local_38;
        if (bVar1) goto LAB_0015cef9;
        local_58.super_IString.str._M_len =
             CONCAT44(local_58.super_IString.str._M_len._4_4_,p_Var3[1]._M_color);
      }
      if (!bVar1) {
        return true;
      }
    }
LAB_0015cef9:
    if (((other->calls != true) ||
        ((this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count +
         (this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
       ((this->calls != true ||
        ((other->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count +
         (other->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) {
      p_Var3 = (this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_40 = &(this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_header;
      bVar1 = p_Var3 == local_40;
      if (!bVar1) {
        local_38 = &(other->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_58.super_IString.str._M_len = *(size_t *)(p_Var3 + 1);
        local_58.super_IString.str._M_str = (char *)p_Var3[1]._M_parent;
        cVar4 = std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::find(&(other->mutableGlobalsRead)._M_t,&local_58);
        if (cVar4._M_node == local_38) {
          do {
            cVar4 = std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::find(&(other->globalsWritten)._M_t,&local_58);
            if ((_Rb_tree_header *)cVar4._M_node !=
                &(other->globalsWritten)._M_t._M_impl.super__Rb_tree_header) break;
            p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
            bVar1 = p_Var3 == local_40;
            if (bVar1) goto LAB_0015cf83;
            local_58.super_IString.str._M_len = *(size_t *)(p_Var3 + 1);
            local_58.super_IString.str._M_str = (char *)p_Var3[1]._M_parent;
            cVar4 = std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::find(&(other->mutableGlobalsRead)._M_t,&local_58);
          } while (cVar4._M_node == local_38);
        }
        if (!bVar1) {
          return true;
        }
      }
LAB_0015cf83:
      p_Var3 = (this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_40 = &(this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header;
      bVar1 = p_Var3 == local_40;
      if (!bVar1) {
        local_38 = &(other->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_58.super_IString.str._M_len = *(size_t *)(p_Var3 + 1);
        local_58.super_IString.str._M_str = (char *)p_Var3[1]._M_parent;
        while (cVar4 = std::
                       _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       ::find(&(other->globalsWritten)._M_t,&local_58), cVar4._M_node == local_38) {
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
          bVar1 = p_Var3 == local_40;
          if (bVar1) goto LAB_0015d056;
          local_58.super_IString.str._M_len = *(size_t *)(p_Var3 + 1);
          local_58.super_IString.str._M_str = (char *)p_Var3[1]._M_parent;
        }
        if (!bVar1) {
          return true;
        }
      }
LAB_0015d056:
      if ((this->trap != true) ||
         ((other->throws_ == false &&
          ((other->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) {
        bVar5 = (this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 |
                this->throws_;
        if ((bVar5 & other->trap) != 1) {
          if (((((this->trapsNeverHappen != true) || (((bVar5 | this->branchesOut) & 1) != 0)) ||
               ((this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
              ((other->branchesOut != false || (other->throws_ != false)))) ||
             (((other->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 ||
              ((other->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)))) {
            if (this->trap != false) {
              if ((other->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                return true;
              }
              if (other->writesMemory != false) {
                return true;
              }
              if (other->writesTable != false) {
                return true;
              }
              if (other->writesStruct != false) {
                return true;
              }
              if (other->writesArray != false) {
                return true;
              }
              if (other->isAtomic != false) {
                return true;
              }
              if (other->calls != false) {
                return true;
              }
            }
            if ((other->trap & 1U) != 0) {
              if ((this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                return true;
              }
              if (this->writesMemory != false) {
                return true;
              }
              if (this->writesTable != false) {
                return true;
              }
              if (this->writesStruct != false) {
                return true;
              }
              if (this->writesArray != false) {
                return true;
              }
              if (this->isAtomic != false) {
                return true;
              }
              if (this->calls != false) {
                return true;
              }
            }
          }
          return false;
        }
      }
      __assert_fail("!((trap && other.throws()) || (throws() && other.trap))",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/effects.h"
                    ,0x14b,"bool wasm::EffectAnalyzer::invalidates(const EffectAnalyzer &)");
    }
  }
  return true;
}

Assistant:

bool invalidates(const EffectAnalyzer& other) {
    if ((transfersControlFlow() && other.hasSideEffects()) ||
        (other.transfersControlFlow() && hasSideEffects()) ||
        ((writesMemory || calls) && other.accessesMemory()) ||
        ((other.writesMemory || other.calls) && accessesMemory()) ||
        ((writesTable || calls) && other.accessesTable()) ||
        ((other.writesTable || other.calls) && accessesTable()) ||
        ((writesStruct || calls) && other.accessesMutableStruct()) ||
        ((other.writesStruct || other.calls) && accessesMutableStruct()) ||
        ((writesArray || calls) && other.accessesArray()) ||
        ((other.writesArray || other.calls) && accessesArray()) ||
        (danglingPop || other.danglingPop)) {
      return true;
    }
    // All atomics are sequentially consistent for now, and ordered wrt other
    // memory references.
    if ((isAtomic && other.accessesMemory()) ||
        (other.isAtomic && accessesMemory())) {
      return true;
    }
    for (auto local : localsWritten) {
      if (other.localsRead.count(local) || other.localsWritten.count(local)) {
        return true;
      }
    }
    for (auto local : localsRead) {
      if (other.localsWritten.count(local)) {
        return true;
      }
    }
    if ((other.calls && accessesMutableGlobal()) ||
        (calls && other.accessesMutableGlobal())) {
      return true;
    }
    for (auto global : globalsWritten) {
      if (other.mutableGlobalsRead.count(global) ||
          other.globalsWritten.count(global)) {
        return true;
      }
    }
    for (auto global : mutableGlobalsRead) {
      if (other.globalsWritten.count(global)) {
        return true;
      }
    }
    // Note that the above includes disallowing the reordering of a trap with an
    // exception (as an exception can transfer control flow inside the current
    // function, so transfersControlFlow would be true) - while we allow the
    // reordering of traps with each other, we do not reorder exceptions with
    // anything.
    assert(!((trap && other.throws()) || (throws() && other.trap)));
    // We can't reorder an implicit trap in a way that could alter what global
    // state is modified. However, in trapsNeverHappen mode we assume traps do
    // not occur in practice, which lets us ignore this, at least in the case
    // that the code executes. As mentioned above, we assume that there is no
    // transfer of control flow between the things we are comparing, so all we
    // need to do is check for such transfers in them.
    if (!trapsNeverHappen || transfersControlFlow() ||
        other.transfersControlFlow()) {
      if ((trap && other.writesGlobalState()) ||
          (other.trap && writesGlobalState())) {
        return true;
      }
    }
    return false;
  }